

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeDistinct(Parse *pParse,int eTnctType,int iTab,int addrRepeat,ExprList *pEList,int regElem)

{
  int p2;
  int iVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  Parse *in_RDI;
  Parse *in_R8;
  undefined4 in_R9D;
  int r1;
  CollSeq *pColl;
  int regPrev;
  int iJump;
  int i;
  Vdbe *v;
  int nResultCol;
  int iRet;
  undefined8 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int op;
  Vdbe *p;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  
  iVar3 = 0;
  iVar2 = *(int *)&in_R8->db;
  p = in_RDI->pVdbe;
  if (in_ESI != 1) {
    if (in_ESI == 2) {
      p2 = in_RDI->nMem + 1;
      in_RDI->nMem = iVar2 + in_RDI->nMem;
      iVar3 = p2;
      iVar1 = sqlite3VdbeCurrentAddr(p);
      iVar1 = iVar1 + iVar2;
      for (op = 0; op < iVar2; op = op + 1) {
        sqlite3ExprCollSeq(in_R8,(Expr *)CONCAT44(in_R9D,iVar3));
        if (op < iVar2 + -1) {
          sqlite3VdbeAddOp3(p,op,iVar1,p2,in_stack_ffffffffffffffb8);
        }
        else {
          sqlite3VdbeAddOp3(p,op,iVar1,p2,in_stack_ffffffffffffffb8);
        }
        sqlite3VdbeChangeP4((Vdbe *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                            (int)((ulong)p >> 0x20),(char *)CONCAT44(op,iVar1),p2);
        sqlite3VdbeChangeP5(p,0x80);
      }
      sqlite3VdbeAddOp3(p,op,iVar1,p2,in_stack_ffffffffffffffb8);
    }
    else {
      iVar2 = sqlite3GetTempReg(in_RDI);
      iVar3 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
      sqlite3VdbeAddOp4Int
                (p,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                 in_stack_ffffffffffffffb8,iVar3);
      sqlite3VdbeAddOp3(p,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      sqlite3VdbeAddOp4Int
                (p,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                 in_stack_ffffffffffffffb8,iVar3);
      sqlite3VdbeChangeP5(p,0x10);
      sqlite3ReleaseTempReg(in_RDI,iVar2);
      iVar3 = in_EDX;
    }
  }
  return iVar3;
}

Assistant:

static int codeDistinct(
  Parse *pParse,     /* Parsing and code generating context */
  int eTnctType,     /* WHERE_DISTINCT_* value */
  int iTab,          /* A sorting index used to test for distinctness */
  int addrRepeat,    /* Jump to here if not distinct */
  ExprList *pEList,  /* Expression for each element */
  int regElem        /* First element */
){
  int iRet = 0;
  int nResultCol = pEList->nExpr;
  Vdbe *v = pParse->pVdbe;

  switch( eTnctType ){
    case WHERE_DISTINCT_ORDERED: {
      int i;
      int iJump;              /* Jump destination */
      int regPrev;            /* Previous row content */

      /* Allocate space for the previous row */
      iRet = regPrev = pParse->nMem+1;
      pParse->nMem += nResultCol;

      iJump = sqlite3VdbeCurrentAddr(v) + nResultCol;
      for(i=0; i<nResultCol; i++){
        CollSeq *pColl = sqlite3ExprCollSeq(pParse, pEList->a[i].pExpr);
        if( i<nResultCol-1 ){
          sqlite3VdbeAddOp3(v, OP_Ne, regElem+i, iJump, regPrev+i);
          VdbeCoverage(v);
        }else{
          sqlite3VdbeAddOp3(v, OP_Eq, regElem+i, addrRepeat, regPrev+i);
          VdbeCoverage(v);
         }
        sqlite3VdbeChangeP4(v, -1, (const char *)pColl, P4_COLLSEQ);
        sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
      }
      assert( sqlite3VdbeCurrentAddr(v)==iJump || pParse->db->mallocFailed );
      sqlite3VdbeAddOp3(v, OP_Copy, regElem, regPrev, nResultCol-1);
      break;
    }

    case WHERE_DISTINCT_UNIQUE: {
      /* nothing to do */
      break;
    }

    default: {
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4Int(v, OP_Found, iTab, addrRepeat, regElem, nResultCol);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regElem, nResultCol, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r1, regElem, nResultCol);
      sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
      sqlite3ReleaseTempReg(pParse, r1);
      iRet = iTab;
      break;
    }
  }

  return iRet;
}